

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O0

void __thiscall
cubeb_passthrough_resampler_fill_short_input_Test::TestBody
          (cubeb_passthrough_resampler_fill_short_input_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  long got;
  uint32_t i;
  float output [64];
  float input [64];
  long output_frame_count;
  long input_frame_count;
  passthrough_resampler<float> resampler;
  uint32_t sample_rate;
  uint32_t channels;
  uint32_t in_stack_fffffffffffffd40;
  uint32_t in_stack_fffffffffffffd44;
  long *in_stack_fffffffffffffd48;
  cubeb_data_callback in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  Type in_stack_fffffffffffffd6c;
  AssertHelper *in_stack_fffffffffffffd70;
  AssertionResult local_288;
  long local_278;
  undefined4 in_stack_fffffffffffffd90;
  uint uVar2;
  void *in_stack_fffffffffffffd98;
  long *in_stack_fffffffffffffda0;
  void *in_stack_fffffffffffffda8;
  passthrough_resampler<float> *in_stack_fffffffffffffdb0;
  Message *in_stack_fffffffffffffdb8;
  AssertHelper *in_stack_fffffffffffffdc0;
  float local_168 [64];
  long local_68;
  long local_60;
  undefined4 local_10;
  uint local_c;
  
  local_c = 2;
  local_10 = 0xac44;
  passthrough_resampler<float>::passthrough_resampler
            ((passthrough_resampler<float> *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
             (cubeb_stream *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
             in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,
             in_stack_fffffffffffffd40);
  local_60 = 0x10;
  local_68 = 0x20;
  memset(local_168,0,0x100);
  memset(&stack0xfffffffffffffd98,0,0x100);
  for (uVar2 = 0; (long)(ulong)uVar2 < (long)(local_60 * (ulong)local_c); uVar2 = uVar2 + 1) {
    local_168[uVar2] = (float)((double)uVar2 * 0.01);
  }
  local_278 = passthrough_resampler<float>::fill
                        (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                         in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                         CONCAT44(uVar2,in_stack_fffffffffffffd90));
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
             (char *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (long *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd70);
    testing::AssertionResult::failure_message((AssertionResult *)0x11158e);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
               (char *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
               in_stack_fffffffffffffd5c,(char *)in_stack_fffffffffffffd50);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    testing::Message::~Message((Message *)0x1115cf);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1115eb);
  if (uVar2 == 0) {
    testing::internal::EqHelper::Compare<long,_long,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
               (char *)in_stack_fffffffffffffd50,(long *)(local_68 + -0x10),
               (long *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd50);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd70);
      testing::AssertionResult::failure_message((AssertionResult *)0x111655);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
                 (char *)CONCAT44(uVar2,in_stack_fffffffffffffd60),in_stack_fffffffffffffd5c,
                 (char *)in_stack_fffffffffffffd50);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
      testing::Message::~Message((Message *)0x111690);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1116ac);
  }
  passthrough_resampler<float>::~passthrough_resampler
            ((passthrough_resampler<float> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  return;
}

Assistant:

TEST(cubeb, passthrough_resampler_fill_short_input)
{
  uint32_t channels = 2;
  uint32_t sample_rate = 44100;
  passthrough_resampler<float> resampler = passthrough_resampler<float>(
      nullptr, passthrough_resampler_fill_short_input, nullptr, channels,
      sample_rate);

  long input_frame_count = 16;
  long output_frame_count = 32;
  float input[64] = {};
  float output[64] = {};
  for (uint32_t i = 0; i < input_frame_count * channels; ++i) {
    input[i] = 0.01 * i;
  }
  long got =
      resampler.fill(input, &input_frame_count, output, output_frame_count);
  ASSERT_EQ(got, output_frame_count);
  // Input frames used are less than the output frames due to glitch.
  ASSERT_EQ(input_frame_count, output_frame_count - 16);
}